

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O3

void Image_Function::Invert
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  uchar *puVar4;
  undefined4 in_register_00000014;
  EVP_PKEY_CTX *src;
  uchar *puVar5;
  ulong uVar6;
  uchar *puVar7;
  uint local_68;
  uint local_64;
  undefined8 local_60;
  ImageTemplate<unsigned_char> local_58;
  
  local_60 = CONCAT44(in_register_00000014,startYIn);
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  bVar3 = CommonColorCount<PenguinV_Image::ImageTemplate<unsigned_char>>(in,out);
  local_64 = (uint)bVar3;
  local_68 = width * local_64;
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  local_58._data = (uchar *)0x0;
  local_58._type = out->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_58,(EVP_PKEY_CTX *)out,src);
  OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (&local_68,&height,in,&local_58);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
  uVar1 = out->_rowSize;
  if (height * uVar1 != 0) {
    uVar2 = in->_rowSize;
    puVar5 = out->_data + (ulong)(startXOut * local_64) + (ulong)(startYOut * uVar1);
    puVar4 = puVar5 + height * uVar1;
    puVar7 = in->_data + (ulong)(startXIn * local_64) + (ulong)((int)local_60 * uVar2);
    do {
      if ((ulong)local_68 != 0) {
        uVar6 = 0;
        do {
          puVar5[uVar6] = ~puVar7[uVar6];
          uVar6 = uVar6 + 1;
        } while (local_68 != uVar6);
      }
      puVar5 = puVar5 + uVar1;
      puVar7 = puVar7 + uVar2;
    } while (puVar5 != puVar4);
  }
  return;
}

Assistant:

void Invert( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                 uint32_t width, uint32_t height )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );

        const uint8_t colorCount  = CommonColorCount( in, out );
        width = width * colorCount;

        OptimiseRoi( width, height, in, out );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn  * colorCount;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut * colorCount;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const uint8_t * inX  = inY;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + width;

            for( ; outX != outXEnd; ++outX, ++inX )
                (*outX) = ~(*inX);
        }
    }